

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *field)

{
  ModuleField *pMVar1;
  FuncModuleField *pFVar2;
  pointer __p;
  _Head_base<0UL,_wabt::ModuleField_*,_false> *field_00;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_60 [11];
  
  pMVar1 = (field->_M_t).
           super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>._M_t.
           super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
           super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl;
  switch(pMVar1->type_) {
  case Func:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    field_00 = local_60 + 10;
    local_60[10]._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                      *)field_00);
    break;
  case Global:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    field_00 = local_60 + 9;
    local_60[9]._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                      *)field_00);
    break;
  case Import:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    field_00 = local_60 + 8;
    local_60[8]._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                      *)field_00);
    break;
  case Export:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    field_00 = local_60 + 7;
    local_60[7]._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                      *)field_00);
    break;
  case Type:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    field_00 = local_60 + 6;
    local_60[6]._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                      *)field_00);
    break;
  case Table:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    field_00 = local_60 + 5;
    local_60[5]._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                      *)field_00);
    break;
  case ElemSegment:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    field_00 = local_60 + 4;
    local_60[4]._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                      *)field_00);
    break;
  case Memory:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    field_00 = local_60 + 3;
    local_60[3]._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                      *)field_00);
    break;
  case DataSegment:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    field_00 = local_60 + 2;
    local_60[2]._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                      *)field_00);
    break;
  case Start:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    field_00 = local_60 + 1;
    local_60[1]._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                      *)field_00);
    break;
  case Tag:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    field_00 = local_60;
    local_60[0]._M_head_impl = pMVar1;
    AppendField(this,(unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_> *
                     )field_00);
    break;
  default:
    goto switchD_0013163f_default;
  }
  pFVar2 = ((_Head_base<0UL,_wabt::FuncModuleField_*,_false> *)
           &(((__uniq_ptr_data<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>,_true,_true>
               *)&field_00->_M_head_impl)->
            super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
            )._M_t.
            super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
            .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>)->_M_head_impl;
  if (pFVar2 != (FuncModuleField *)0x0) {
    (**(code **)(*(long *)&(pFVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).
                           super_ModuleField + 8))();
    return;
  }
switchD_0013163f_default:
  return;
}

Assistant:

void LocalTypes::Set(const TypeVector& types) {
  decls_.clear();
  if (types.empty()) {
    return;
  }

  Type type = types[0];
  Index count = 1;
  for (Index i = 1; i < types.size(); ++i) {
    if (types[i] != type) {
      decls_.emplace_back(type, count);
      type = types[i];
      count = 1;
    } else {
      ++count;
    }
  }
  decls_.emplace_back(type, count);
}